

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpd.cpp
# Opt level: O1

void __thiscall http::Server::Task(Server *this)

{
  TCPConnection *connection;
  Page *this_00;
  
  do {
    while( true ) {
      connection = TCPConnection::Listen(this->ListenerConnection);
      this_00 = (Page *)osQueue::Get(&this->PagePool);
      if (this_00 == (Page *)0x0) break;
      Page::Initialize(this_00,connection);
      osThread::Create(&this_00->Thread,ConnectionHandlerEntry,"Page",0x400,100,this_00);
    }
    puts("Error: Out of pages");
  } while( true );
}

Assistant:

void http::Server::Task()
{
    TCPConnection* connection;
    Page* page;

    while (1)
    {
        connection = ListenerConnection->Listen();

        // Spawn off a thread to handle this connection
        page = (Page*)PagePool.Get();
        if (page)
        {
            page->Initialize(connection);
            page->Thread.Create(ConnectionHandlerEntry, "Page", 1024, 100, page);
        }
        else
        {
            printf("Error: Out of pages\n");
        }
    }
}